

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O1

int __thiscall iqnet::Socket::accept(Socket *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int h;
  network_error *this_00;
  undefined4 in_register_00000034;
  socklen_t len;
  sockaddr_in addr;
  undefined1 local_58 [36];
  socklen_t local_34;
  SystemSockAddrIn local_30;
  
  local_34 = 0x10;
  h = ::accept(*(int *)(CONCAT44(in_register_00000034,__fd) + 8),(sockaddr *)&local_30,&local_34);
  if (h != -1) {
    Inet_addr::Inet_addr((Inet_addr *)local_58,&local_30);
    Socket(this,h,(Inet_addr *)local_58);
    local_58._0_8_ = &PTR__Inet_addr_00188ef8;
    boost::detail::shared_count::~shared_count((shared_count *)(local_58 + 0x10));
    return (int)this;
  }
  this_00 = (network_error *)__cxa_allocate_exception(0x10);
  local_58._0_8_ = local_58 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Socket::accept","");
  network_error::network_error(this_00,(string *)local_58,true,0);
  __cxa_throw(this_00,&network_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Socket Socket::accept()
{
  sockaddr_in addr;
  socklen_t len = sizeof(sockaddr_in);

  Handler new_sock = ::accept( sock, reinterpret_cast<sockaddr*>(&addr), &len );
  if( new_sock == -1 )
    throw network_error( "Socket::accept" );

  return Socket( new_sock, Inet_addr(addr) );
}